

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * read_input(string *__return_storage_ptr__,string *input_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string in;
  ifstream input;
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream((string *)&input);
  std::ifstream::open((string *)&input,(_Ios_Openmode)input_filename);
  paVar1 = &in.field_2;
  in._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&in,*(undefined8 *)((long)auStack_138 + *(long *)(_input + -0x18)),
             0xffffffffffffffff,0,0xffffffff);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(in.field_2._M_allocated_capacity._1_7_,in.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = in.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = in._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(in.field_2._M_allocated_capacity._1_7_,in.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = in._M_string_length;
  in._M_string_length = 0;
  in.field_2._M_local_buf[0] = '\0';
  in._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::~string((string *)&in);
  std::ifstream::~ifstream(&input);
  return __return_storage_ptr__;
}

Assistant:

string read_input(std::string& input_filename) {
  ifstream input;
  input.open(input_filename);
  auto in = std::string(istreambuf_iterator<char>(input),
                        istreambuf_iterator<char>());
  return std::move(in);
}